

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.c
# Opt level: O3

expression * cast_to(dmr_C *C,expression *old,symbol *type)

{
  int iVar1;
  position pVar2;
  ulong uVar3;
  expression *peVar4;
  char cVar5;
  symbol *psVar6;
  ulong uVar7;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  uint uVar12;
  symbol *psVar13;
  
  warn_for_different_enum_types(C,old->pos,old->ctype,type);
  psVar6 = old->ctype;
  if (psVar6 != &C->S->null_ctype) {
    if (psVar6 == (symbol *)0x0) {
      psVar6 = (symbol *)0x0;
      uVar3 = 0;
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar3 = 0;
      do {
        uVar3 = uVar3 | (psVar6->field_14).field_2.ctype.modifiers;
        uVar9 = *(uint *)((long)&psVar6->field_14 + 0x30) | uVar9;
        if (*(char *)psVar6 != '\x03') goto LAB_0010e78c;
        psVar6 = (psVar6->field_14).field_2.ctype.base_type;
      } while (psVar6 != (symbol *)0x0);
      psVar6 = (symbol *)0x0;
    }
LAB_0010e78c:
    if (type == (symbol *)0x0) {
      psVar13 = (symbol *)0x0;
      uVar11 = 0;
      uVar12 = 0;
    }
    else {
      uVar12 = 0;
      uVar11 = 0;
      psVar13 = type;
      do {
        uVar11 = uVar11 | (psVar13->field_14).field_2.ctype.modifiers;
        uVar12 = *(uint *)((long)&psVar13->field_14 + 0x30) | uVar12;
        if (*(char *)psVar13 != '\x03') goto LAB_0010e7c4;
        psVar13 = (psVar13->field_14).field_2.ctype.base_type;
      } while (psVar13 != (symbol *)0x0);
      psVar13 = (symbol *)0x0;
    }
LAB_0010e7c4:
    if ((psVar6 == psVar13) && (uVar9 == uVar12)) {
      uVar7 = (uVar11 ^ uVar3) & 0xffffffffad23fff0;
      if (uVar7 == 0) {
        return old;
      }
      if (uVar7 == 0x10) goto LAB_0010e82b;
    }
    if ((((uint)uVar11 | (uint)uVar3) >> 0x14 & 1) != 0) {
      pcVar10 = "to/from";
      if (((uint)uVar11 >> 0x14 & 1) == 0) {
        pcVar10 = "from";
      }
      pcVar8 = "to";
      if (((uint)uVar3 >> 0x14 & 1) != 0) {
        pcVar8 = pcVar10;
      }
      dmrC_warning(C,old->pos,"implicit cast %s nocast type",pcVar8);
    }
  }
LAB_0010e82b:
  if (*(char *)old == '\r') {
    warn_for_different_enum_types(C,old->pos,old->ctype,type);
    iVar1 = (type->field_14).field_1.normal;
    if (iVar1 <= (old->ctype->field_14).field_1.normal) {
      peVar4 = (old->field_5).field_6.right;
      psVar6 = peVar4->ctype;
      if ((psVar6->field_14).field_1.normal == iVar1) {
        cVar5 = (char)*(undefined4 *)((long)&type->field_14 + 0xc);
        if (*(char *)((long)&psVar6->field_14 + 0xc) == cVar5) {
          return peVar4;
        }
      }
      else {
        cVar5 = (char)*(undefined4 *)((long)&type->field_14 + 0xc);
      }
      if (cVar5 == *(char *)((long)&old->ctype->field_14 + 0xc)) {
        old->ctype = type;
        (old->field_5).field_4.symbol = type;
        return old;
      }
    }
  }
  else if (((*(char *)old == '\t') &&
           ((type->field_14).field_1.normal <= (old->ctype->field_14).field_1.normal)) &&
          (old->op == 0x7e)) {
    old->ctype = type;
    peVar4 = cast_to(C,(old->field_5).field_3.unop,type);
    (old->field_5).field_3.unop = peVar4;
    return old;
  }
  pVar2 = old->pos;
  peVar4 = (expression *)dmrC_allocator_allocate(&C->expression_allocator,0);
  *(undefined1 *)peVar4 = 0xd;
  peVar4->pos = pVar2;
  *(ushort *)peVar4 = (ushort)(byte)old->field_0x1 << 8 | 0xd;
  peVar4->ctype = type;
  (peVar4->field_5).field_4.symbol = type;
  (peVar4->field_5).field_6.right = old;
  if (*(char *)type == '\x03') {
    type = (type->field_14).field_2.ctype.base_type;
  }
  if (type == &C->S->bool_ctype) {
    cast_to_bool(C,peVar4);
  }
  return peVar4;
}

Assistant:

static struct expression * cast_to(struct dmr_C *C, struct expression *old, struct symbol *type)
{
	struct expression *expr;

	warn_for_different_enum_types (C, old->pos, old->ctype, type);

	if (old->ctype != &C->S->null_ctype && is_same_type(C, old, type))
		return old;

	/*
	 * See if we can simplify the op. Move the cast down.
	 */
	switch (old->type) {
	case EXPR_PREOP:
		if (old->ctype->bit_size < type->bit_size)
			break;
		if (old->op == '~') {
			old->ctype = type;
			old->unop = cast_to(C, old->unop, type);
			return old;
		}
		break;

	case EXPR_IMPLIED_CAST:
		warn_for_different_enum_types(C, old->pos, old->ctype, type);

		if (old->ctype->bit_size >= type->bit_size) {
			struct expression *orig = old->cast_expression;
			if (same_cast_type(C, orig->ctype, type))
				return orig;
			if (old->ctype->bit_offset == type->bit_offset) {
				old->ctype = type;
				old->cast_type = type;
				return old;
			}
		}
		break;

	default:
		/* nothing */;
	}

	expr = dmrC_alloc_expression(C, old->pos, EXPR_IMPLIED_CAST);
	expr->flags = old->flags;
	expr->ctype = type;
	expr->cast_type = type;
	expr->cast_expression = old;

	if (dmrC_is_bool_type(C->S, type))
		cast_to_bool(C, expr);

	return expr;
}